

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rational.hpp
# Opt level: O2

rational<unsigned_char> * __thiscall
tcb::rational<unsigned_char>::operator/=
          (rational<unsigned_char> *this,rational<unsigned_char> *other)

{
  this->num_ = this->num_ * other->denom_;
  this->denom_ = this->denom_ * other->num_;
  simplify(this);
  return this;
}

Assistant:

TCB_CONSTEXPR14 rational& operator/=(const rational<U>& other)
    {
        num_ *= other.denom();
        denom_ *= other.num();
        simplify();
        return *this;
    }